

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

osfildef * osfoprwt(char *fname,os_filetype_t param_2)

{
  char *in_RDI;
  osfildef *fp;
  FILE *local_18;
  
  local_18 = fopen(in_RDI,"r+");
  if (local_18 == (FILE *)0x0) {
    local_18 = fopen(in_RDI,"w+");
  }
  return (osfildef *)local_18;
}

Assistant:

osfildef*
osfoprwt( const char* fname, os_filetype_t )
{
//  assert(fname != 0);
    // Try opening the file in read/write mode.
    osfildef* fp = fopen(fname, "r+");
    // If opening the file failed, it probably means that it doesn't
    // exist.  In that case, create a new file in read/write mode.
    if (fp == 0) fp = fopen(fname, "w+");
    return fp;
}